

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

MultiplyBroadcastableLayerParams * __thiscall
CoreML::Specification::MultiplyBroadcastableLayerParams::New
          (MultiplyBroadcastableLayerParams *this,Arena *arena)

{
  MultiplyBroadcastableLayerParams *this_00;
  
  this_00 = (MultiplyBroadcastableLayerParams *)operator_new(0x18);
  MultiplyBroadcastableLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::MultiplyBroadcastableLayerParams>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

MultiplyBroadcastableLayerParams* MultiplyBroadcastableLayerParams::New(::google::protobuf::Arena* arena) const {
  MultiplyBroadcastableLayerParams* n = new MultiplyBroadcastableLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}